

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-menu.c
# Opt level: O1

_Bool menu_handle_keypress(menu_conflict *menu,ui_event *in,ui_event *out)

{
  uint uVar1;
  keycode_t kVar2;
  byte *pbVar3;
  ui_event *puVar4;
  byte bVar5;
  _Bool _Var6;
  uint uVar7;
  ui_event_type uVar8;
  wchar_t wVar9;
  int cursor;
  int *piVar10;
  __int32_t **pp_Var11;
  ushort **ppuVar12;
  int iVar13;
  ui_event uVar20;
  uint8_t extraout_DL;
  char c;
  ui_event *puVar14;
  uint uVar15;
  byte bVar16;
  ulong uVar17;
  long lVar18;
  ui_event *puVar19;
  
  piVar10 = &menu->filter_count;
  if (menu->filter_list == (int *)0x0) {
    piVar10 = &menu->count;
  }
  uVar1 = *piVar10;
  uVar17 = (ulong)in->mouse >> 0x20;
  uVar15 = menu->flags;
  if ((uVar15 & 8) != 0) {
    pp_Var11 = __ctype_toupper_loc();
    uVar17 = (ulong)(uint)(*pp_Var11)[uVar17 & 0xff];
  }
  if (((uVar15 & 0x40) != 0) &&
     (ppuVar12 = __ctype_b_loc(), (*(byte *)((long)*ppuVar12 + (uVar17 & 0xff) * 2 + 1) & 8) != 0))
  {
    uVar7 = (uint)(byte)menu->inscriptions[(uint)uVar17 - 0x30];
    if (menu->inscriptions[(uint)uVar17 - 0x30] == 0) {
      uVar7 = (uint)uVar17;
    }
    uVar17 = (ulong)uVar7;
  }
  if ((uVar15 & 2) == 0) {
    bVar16 = (byte)uVar17;
    if ((uVar15 & 1) == 0) {
      if (((uVar15 & 4) == 0) && (pbVar3 = (byte *)menu->selections, pbVar3 != (byte *)0x0)) {
        bVar5 = *pbVar3;
        if (bVar5 != 0) {
          lVar18 = 0;
          do {
            if ((uVar15 & 8) != 0) {
              pp_Var11 = __ctype_toupper_loc();
              bVar5 = *(byte *)(*pp_Var11 + bVar5);
            }
            if (bVar16 == bVar5) {
              iVar13 = (int)lVar18;
              goto LAB_001f6033;
            }
            bVar5 = pbVar3[lVar18 + 1];
            lVar18 = lVar18 + 1;
          } while (bVar5 != 0);
        }
      }
      else if ((menu->row_funcs->get_tag != (_func_char_menu_ptr_int *)0x0) && (0 < (int)uVar1)) {
        puVar19 = (ui_event *)0x0;
        puVar14 = out;
        do {
          if (menu->filter_list == (int *)0x0) {
            iVar13 = (int)puVar19;
          }
          else {
            iVar13 = menu->filter_list[(long)puVar19];
          }
          bVar5 = (*menu->row_funcs->get_tag)(menu,iVar13);
          if (((menu->flags & 8) != 0) && (bVar5 != 0)) {
            pp_Var11 = __ctype_toupper_loc();
            bVar5 = *(byte *)(*pp_Var11 + bVar5);
          }
          puVar4 = puVar14;
          if (bVar16 == bVar5 && bVar5 != 0) {
            puVar4 = puVar19;
          }
          puVar14 = (ui_event *)((ulong)puVar4 & 0xffffffff);
          if (bVar16 == bVar5 && bVar5 != 0) {
            iVar13 = (int)puVar4;
            goto LAB_001f6033;
          }
          puVar19 = (ui_event *)((long)&puVar19->type + 1);
        } while ((ui_event *)(ulong)uVar1 != puVar19);
      }
    }
    else if (0 < (int)uVar1) {
      uVar15 = 0;
      do {
        bVar5 = (*menu->skin->get_tag)(menu,uVar15);
        if (((menu->flags & 8) != 0) && (bVar5 != 0)) {
          pp_Var11 = __ctype_toupper_loc();
          bVar5 = *(byte *)(*pp_Var11 + bVar5);
        }
        if (bVar16 == bVar5 && bVar5 != 0) {
          iVar13 = menu->top + uVar15;
          goto LAB_001f6033;
        }
        uVar15 = uVar15 + 1;
      } while (uVar1 != uVar15);
    }
  }
  iVar13 = -1;
LAB_001f6033:
  if ((iVar13 < 0) || (_Var6 = is_valid_row(menu,iVar13), !_Var6)) {
    kVar2 = (in->key).code;
    if (kVar2 == 0xe000) {
      out->type = EVT_ESCAPE;
    }
    else {
      if ((int)uVar1 < 1) {
        return true;
      }
      if (kVar2 == 0x9c) {
        out->type = EVT_SELECT;
      }
      else {
        if (kVar2 == 0x20) {
          iVar13 = (menu->active).page_rows;
          if (iVar13 < (int)uVar1) {
            iVar13 = iVar13 + menu->cursor;
            if ((int)(uVar1 - 1) <= iVar13) {
              iVar13 = 0;
            }
            menu->cursor = iVar13;
            menu->top = iVar13;
            out->type = EVT_MOVE;
            return false;
          }
          return (int)uVar1 <= iVar13;
        }
        wVar9 = target_dir(in->key);
        if (wVar9 != L'\0') {
          _Var6 = is_valid_row(menu,0);
          if (!_Var6) {
            uVar15 = 1;
            do {
              uVar7 = uVar15;
              if (uVar1 == uVar7) break;
              _Var6 = is_valid_row(menu,uVar7);
              uVar15 = uVar7 + 1;
            } while (!_Var6);
            if ((int)uVar1 <= (int)uVar7) {
              return false;
            }
          }
          uVar20._0_8_ = (*menu->skin->process_dir)(menu,wVar9);
          out->mouse = uVar20.mouse;
          (out->key).mods = extraout_DL;
          if (uVar20.mouse.type == EVT_MOVE) {
            _Var6 = is_valid_row(menu,menu->cursor);
            if (!_Var6) {
              do {
                iVar13 = menu->cursor;
                cursor = 0;
                if ((iVar13 < (int)uVar1) && (cursor = uVar1 - 1, -1 < iVar13)) {
                  cursor = iVar13 + ddy[wVar9];
                }
                menu->cursor = cursor;
                _Var6 = is_valid_row(menu,cursor);
              } while (!_Var6);
            }
            if (menu->cursor < 0) {
              __assert_fail("menu->cursor >= 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-menu.c"
                            ,0x2ec,
                            "_Bool menu_handle_keypress(struct menu *, const ui_event *, ui_event *)"
                           );
            }
            if ((int)uVar1 <= menu->cursor) {
              __assert_fail("menu->cursor < count",
                            "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-menu.c"
                            ,0x2ed,
                            "_Bool menu_handle_keypress(struct menu *, const ui_event *, ui_event *)"
                           );
            }
          }
        }
      }
    }
  }
  else {
    uVar8 = EVT_SELECT;
    if ((menu->flags & 0x10) != 0) {
      uVar8 = (uint)(iVar13 == menu->cursor) * 0x20 + EVT_MOVE;
    }
    out->type = uVar8;
    menu->cursor = iVar13;
  }
  return false;
}

Assistant:

bool menu_handle_keypress(struct menu *menu, const ui_event *in,
		ui_event *out)
{
	bool eat = false;
	int count = menu->filter_list ? menu->filter_count : menu->count;

	/* Get the new cursor position from the menu item tags */
	int new_cursor = get_cursor_key(menu, menu->top, in->key);
	if (new_cursor >= 0 && is_valid_row(menu, new_cursor)) {
		if (!(menu->flags & MN_DBL_TAP) || new_cursor == menu->cursor)
			out->type = EVT_SELECT;
		else
			out->type = EVT_MOVE;

		menu->cursor = new_cursor;
	} else if (in->key.code == ESCAPE) {
		/* Escape stops us here */
		out->type = EVT_ESCAPE;
	} else if (count <= 0) {
		/* Menus with no rows can't be navigated or used, so eat keypresses */
		eat = true;
	} else if (in->key.code == ' ') {
		/* Try existing, known keys */
		int rows = menu->active.page_rows;
		int total = count;

		if (rows < total) {
			/* Go to start of next page */
			menu->cursor += menu->active.page_rows;
			if (menu->cursor >= total - 1) menu->cursor = 0;
			menu->top = menu->cursor;
	
			out->type = EVT_MOVE;
		} else {
			eat = true;
		}
	} else if (in->key.code == KC_ENTER) {
		out->type = EVT_SELECT;
	} else {
		/* Try directional movement */
		int dir = target_dir(in->key);

		if (dir && !no_valid_row(menu, count)) {
			*out = menu->skin->process_dir(menu, dir);

			if (out->type == EVT_MOVE) {
				while (!is_valid_row(menu, menu->cursor)) {
					/* Loop around */
					if (menu->cursor > count - 1)
						menu->cursor = 0;
					else if (menu->cursor < 0)
						menu->cursor = count - 1;
					else
						menu->cursor += ddy[dir];
				}
			
				assert(menu->cursor >= 0);
				assert(menu->cursor < count);
			}
		}
	}

	return eat;
}